

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall PluginManagerTest_PluginName_Test::TestBody(PluginManagerTest_PluginName_Test *this)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  char pluginName [20];
  AssertHelper AStack_48;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char local_28 [32];
  
  plVar1 = (long *)IPluginManager::Get();
  lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,"pluginA");
  if (lVar2 != 0) {
    plVar1 = (long *)IPluginManager::Get();
    plVar1 = (long *)(**(code **)(*plVar1 + 0x20))(plVar1,"pluginA");
    pcVar3 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    strcpy(local_28,pcVar3);
    plVar1 = (long *)IPluginManager::Get();
    (**(code **)(*plVar1 + 0x18))(plVar1,"pluginA");
  }
  testing::internal::CmpHelperSTREQ(local_38,"\"PluginA\"","pluginName","PluginA",local_28);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/tests/test.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_40._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST( PluginManagerTest, PluginName )
{
	char pluginName[20];
	if ( IPluginManager::Get()->loadPlugin( "pluginA" ) )
	{
		auto plugin = IPluginManager::Get()->getPlugin( "pluginA" );
		strcpy( pluginName, plugin->name() );
		IPluginManager::Get()->unloadPlugin( "pluginA" );
	}

	EXPECT_STREQ( "PluginA", pluginName );
}